

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemotelyControlledSampler.cpp
# Opt level: O0

SamplingStatus * __thiscall
jaegertracing::samplers::RemotelyControlledSampler::isSampled
          (SamplingStatus *__return_storage_ptr__,RemotelyControlledSampler *this,TraceID *id,
          string *operation)

{
  bool bVar1;
  element_type *peVar2;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  string *operation_local;
  TraceID *id_local;
  RemotelyControlledSampler *this_local;
  
  lock._M_device = (mutex_type *)operation;
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->_mutex);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_sampler);
  if (!bVar1) {
    __assert_fail("_sampler",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/RemotelyControlledSampler.cpp"
                  ,0x73,
                  "virtual SamplingStatus jaegertracing::samplers::RemotelyControlledSampler::isSampled(const TraceID &, const std::string &)"
                 );
  }
  peVar2 = std::
           __shared_ptr_access<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_sampler);
  (*peVar2->_vptr_Sampler[2])(__return_storage_ptr__,peVar2,id,lock._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return __return_storage_ptr__;
}

Assistant:

SamplingStatus
RemotelyControlledSampler::isSampled(const TraceID& id,
                                     const std::string& operation)
{
    std::lock_guard<std::mutex> lock(_mutex);
    assert(_sampler);
    return _sampler->isSampled(id, operation);
}